

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageProcess.cpp
# Opt level: O0

void ac::core::detail::yuva2rgba<unsigned_char,unsigned_char>(Image *srcy,Image *srcuva,Image *dst)

{
  Image *in_stack_00000058;
  Image *in_stack_00000060;
  Image *in_stack_00000068;
  anon_class_1_0_00000001 *in_stack_00000070;
  
  filter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_TianZerL[P]Anime4KCPP_core_src_ImageProcess_cpp:293:16),_const_ac::core::Image,_const_ac::core::Image,_ac::core::Image,_true>
            (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058);
  return;
}

Assistant:

inline void yuva2rgba(const Image& srcy, const Image& srcuva, Image& dst)
    {
        filter([](const int /*i*/, const int /*j*/, const void* const yptr, const void* const uvaptr, void* const dptr) {
            auto yin = static_cast<const IN*>(yptr);
            auto uvain = static_cast<const IN*>(uvaptr);
            auto out = static_cast<OUT*>(dptr);

            float y = toFloat(yin[0]);
            float u = toFloat(uvain[0]) - 0.5f;
            float v = toFloat(uvain[1]) - 0.5f;

            float r = y + 1.403f * v;
            float g = y - 0.344f * u - 0.714f * v;
            float b = y + 1.773f * u;

            out[0] = fromFloat<OUT>(r);
            out[1] = fromFloat<OUT>(g);
            out[2] = fromFloat<OUT>(b);
            if constexpr (std::is_same_v<IN, OUT>) out[3] = uvain[2];
            else out[3] = fromFloat<OUT>(toFloat(uvain[2]));
        }, srcy, srcuva, dst);
    }